

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O3

void Cmd_dumpgeometry(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  subsector_t *psVar5;
  seg_t *psVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  sector_t *psVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  BYTE *pBVar16;
  
  if (0 < numsectors) {
    lVar13 = 0;
    do {
      psVar10 = sectors;
      Printf(5,"Sector %d\n");
      if (0 < psVar10[lVar13].subsectorcount) {
        lVar11 = 0;
        do {
          psVar5 = psVar10[lVar13].subsectors[lVar11];
          pBVar16 = "hacked";
          if ((psVar5->hacked & 1U) == 0) {
            pBVar16 = "";
          }
          Printf(5,"    Subsector %d - real sector = %d - %s\n",
                 (ulong)(uint)((int)((ulong)((long)psVar5 - (long)subsectors) >> 5) * -0x55555555),
                 (ulong)(uint)psVar5->sector->sectornum,pBVar16);
          if (psVar5->numlines != 0) {
            lVar15 = 0;
            uVar14 = 0;
            do {
              psVar6 = psVar5->firstline;
              lVar7 = *(long *)((long)&psVar6->linedef + lVar15);
              uVar12 = (ulong)(uint)((int)((ulong)((long)psVar6 + (lVar15 - (long)segs)) >> 3) *
                                    0x38e38e39);
              puVar8 = *(undefined8 **)((long)&psVar6->v1 + lVar15);
              puVar9 = *(undefined8 **)((long)&psVar6->v2 + lVar15);
              uVar1 = *puVar8;
              uVar2 = puVar8[1];
              uVar3 = *puVar9;
              uVar4 = puVar9[1];
              if (lVar7 == 0) {
                Printf(5,"      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, miniseg",uVar1,uVar2,uVar3,
                       uVar4,uVar12);
              }
              else {
                Printf(5,"      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, linedef %d, side %d",uVar1,
                       uVar2,uVar3,uVar4,uVar12,
                       (ulong)(uint)((int)((ulong)(lVar7 - (long)lines) >> 3) * 0x286bca1b),
                       (ulong)(*(long *)((long)&psVar6->sidedef + lVar15) != *(long *)(lVar7 + 0x48)
                              ));
              }
              lVar7 = *(long *)((long)&psVar6->PartnerSeg + lVar15);
              if (lVar7 == 0) {
                lVar7 = *(long *)((long)&psVar6->backsector + lVar15);
                if (lVar7 != 0) {
                  Printf(5,", back sector = %d (no partnerseg)",(ulong)*(uint *)(lVar7 + 0x1fc));
                }
              }
              else {
                Printf(5,", back sector = %d, real back sector = %d",
                       (ulong)*(uint *)(*(long *)(*(long *)(lVar7 + 0x38) + 0x20) + 0x1fc),
                       (ulong)*(uint *)(*(long *)(lVar7 + 0x20) + 0x1fc));
              }
              Printf(5,"\n");
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + 0x48;
            } while (uVar14 < psVar5->numlines);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < psVar10[lVar13].subsectorcount);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < numsectors);
  }
  return;
}

Assistant:

CCMD(dumpgeometry)
{
	for(int i=0;i<numsectors;i++)
	{
		sector_t * sector = &sectors[i];

		Printf(PRINT_LOG, "Sector %d\n",i);
		for(int j=0;j<sector->subsectorcount;j++)
		{
			subsector_t * sub = sector->subsectors[j];

			Printf(PRINT_LOG, "    Subsector %d - real sector = %d - %s\n", int(sub-subsectors), sub->sector->sectornum, sub->hacked&1? "hacked":"");
			for(DWORD k=0;k<sub->numlines;k++)
			{
				seg_t * seg = sub->firstline + k;
				if (seg->linedef)
				{
				Printf(PRINT_LOG, "      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, linedef %d, side %d", 
					seg->v1->fX(), seg->v1->fY(), seg->v2->fX(), seg->v2->fY(),
					int(seg-segs), int(seg->linedef-lines), seg->sidedef != seg->linedef->sidedef[0]);
				}
				else
				{
					Printf(PRINT_LOG, "      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, miniseg", 
						seg->v1->fX(), seg->v1->fY(), seg->v2->fX(), seg->v2->fY(),
						int(seg-segs));
				}
				if (seg->PartnerSeg) 
				{
					subsector_t * sub2 = seg->PartnerSeg->Subsector;
					Printf(PRINT_LOG, ", back sector = %d, real back sector = %d", sub2->render_sector->sectornum, seg->PartnerSeg->frontsector->sectornum);
				}
				else if (seg->backsector)
				{
					Printf(PRINT_LOG, ", back sector = %d (no partnerseg)", seg->backsector->sectornum);
				}

				Printf(PRINT_LOG, "\n");
			}
		}
	}
}